

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> * __thiscall
pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>::
def<anurbs::Ref<anurbs::Line<3l>>(*)(anurbs::Model&,std::shared_ptr<anurbs::Line<3l>>,std::__cxx11::string_const&),pybind11::arg,pybind11::arg>
          (class_<anurbs::Model,std::shared_ptr<anurbs::Model>> *this,char *name_,
          _func_Ref<anurbs::Line<3L>_>_Model_ptr_shared_ptr<anurbs::Line<3L>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
          **f,arg *extra,arg *extra_1)

{
  _func_Ref<anurbs::Line<3L>_>_Model_ptr_shared_ptr<anurbs::Line<3L>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *f_00;
  cpp_function cf;
  is_method local_68;
  cpp_function local_60;
  handle local_58;
  object local_50;
  char *local_48 [4];
  sibling local_28;
  
  f_00 = *f;
  local_68.class_.m_ptr = *(handle *)this;
  local_50.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_48[0] = name_;
  getattr((pybind11 *)&local_58,local_68.class_,name_,(PyObject *)&_Py_NoneStruct);
  local_28.value.m_ptr = (handle)(handle)local_58.m_ptr;
  cpp_function::
  cpp_function<anurbs::Ref<anurbs::Line<3l>>,anurbs::Model&,std::shared_ptr<anurbs::Line<3l>>,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling,pybind11::arg,pybind11::arg>
            (&local_60,f_00,(name *)local_48,&local_68,&local_28,extra,extra_1);
  pybind11::object::~object((object *)&local_58);
  pybind11::object::~object(&local_50);
  cpp_function::name((cpp_function *)&local_68);
  detail::object_api<pybind11::handle>::attr
            ((obj_attr_accessor *)local_48,(object_api<pybind11::handle> *)this,local_68.class_);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::operator=
            ((accessor<pybind11::detail::accessor_policies::obj_attr> *)local_48,&local_60);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor
            ((accessor<pybind11::detail::accessor_policies::obj_attr> *)local_48);
  pybind11::object::~object((object *)&local_68);
  pybind11::object::~object((object *)&local_60);
  return (class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *)this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(method_adaptor<type>(std::forward<Func>(f)), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = cf;
        return *this;
    }